

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Maze.cpp
# Opt level: O2

Room * __thiscall Maze::RoomNo(Maze *this,int n)

{
  int iVar1;
  vector<Room_*,_std::allocator<Room_*>_> *pvVar2;
  pointer ppRVar3;
  
  pvVar2 = this->mRoomVec;
  ppRVar3 = (pvVar2->super__Vector_base<Room_*,_std::allocator<Room_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    if (ppRVar3 ==
        (pvVar2->super__Vector_base<Room_*,_std::allocator<Room_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      return (Room *)0x0;
    }
    iVar1 = Room::GetRoomNumber(*ppRVar3);
    if (iVar1 == n) break;
    ppRVar3 = ppRVar3 + 1;
    pvVar2 = this->mRoomVec;
  }
  return *ppRVar3;
}

Assistant:

Room* Maze::RoomNo(int n) const  
{  
    std::vector<Room*>::const_iterator it = mRoomVec->begin();  
    for ( ; it != mRoomVec->end(); ++it)  
    {  
        if ( (*it)->GetRoomNumber() == n )
        {  
            return (*it);  
            break;  
        }  
    }  
    return 0;  
}